

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray *
xxflate(QByteArray *__return_storage_ptr__,ZLibOp op,QArrayDataPointer<char> *out,
       QByteArrayView input,function_ref<int_(z_stream_s_*)_const> init,
       function_ref<int_(z_stream_s_*,_unsigned_long)_const> processChunk,
       function_ref<void_(z_stream_s_*)_const> deinit)

{
  Data *pDVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  qsizetype qVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QMessageLogger local_e8;
  ulong uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined4 local_5c;
  char *local_58;
  ThunkPtr *local_50;
  QMessageLogger *local_48;
  undefined8 local_40;
  QByteArray *local_38;
  
  uVar7 = input.m_size;
  local_38 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  if (out->ptr == (char *)0x0) {
    local_e8.context.version = 2;
    local_e8.context.line = 0;
    local_e8.context.file._0_4_ = 0;
    local_e8.context.file._4_4_ = 0;
    local_e8.context.function._0_4_ = 0;
    local_e8.context.function._4_4_ = 0;
    local_e8.context.category = "default";
    pcVar5 = "qCompress";
    if (op != Compression) {
      pcVar5 = "qUncompress";
    }
    QMessageLogger::warning(&local_e8,"%s: %s",pcVar5,"Not enough memory");
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (out->d == (Data *)0x0) {
      qVar6 = 0;
    }
    else {
      qVar6 = (out->d->super_QArrayData).alloc;
    }
    local_90 = 0;
    uStack_88 = 0;
    local_a0 = 0;
    uStack_98 = 0;
    local_b0 = 0;
    uStack_a8 = 0;
    local_c0 = 0;
    pcStack_b8 = (char *)0x0;
    local_e8.context.category = (char *)0x0;
    uStack_c8 = 0;
    local_e8.context.file._0_4_ = 0;
    local_e8.context.file._4_4_ = 0;
    local_e8.context.function._0_4_ = 0;
    local_e8.context.function._4_4_ = 0;
    local_80 = 0;
    local_e8.context.version = (int)input.m_data;
    local_e8.context.line = input.m_data._4_4_;
    local_70 = &local_e8;
    iVar2 = (*init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_bound_entity.fun)
                      ();
    if (iVar2 == 0) {
      local_50 = &processChunk.
                  super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
                  m_thunk_ptr;
      local_40 = 0xaaaaaaaaaaaaaa01;
      local_48 = &local_e8;
      do {
        if ((int)uStack_c8 == 0) {
          lVar4 = out->size;
          uVar3 = qVar6 - lVar4;
          if (uVar3 == 0) {
            QArrayDataPointer<char>::reallocateAndGrow
                      (out,GrowsAtEnd,1,(QArrayDataPointer<char> *)0x0);
            pcVar5 = out->ptr;
            if (pcVar5 == (char *)0x0) {
              local_70._0_4_ = 2;
              local_70._4_4_ = 0;
              uStack_68 = 0;
              uStack_64 = 0;
              local_5c = 0;
              local_58 = "default";
              pcVar5 = "qCompress";
              if (op != Compression) {
                pcVar5 = "qUncompress";
              }
              QMessageLogger::warning
                        ((QMessageLogger *)&local_70,"%s: %s",pcVar5,"Not enough memory");
              goto LAB_003001bc;
            }
            if (out->d == (Data *)0x0) {
              qVar6 = 0;
            }
            else {
              qVar6 = (out->d->super_QArrayData).alloc;
            }
            lVar4 = out->size;
            uVar3 = qVar6 - lVar4;
          }
          else {
            pcVar5 = out->ptr;
          }
          local_e8.context.category = pcVar5 + lVar4;
          if (0xfffffffe < uVar3) {
            uVar3 = 0xffffffff;
          }
          uStack_c8 = CONCAT44(uStack_c8._4_4_,(int)uVar3);
          out->size = uVar3 + lVar4;
        }
        if ((int)local_e8.context.file == 0) {
          uVar3 = 0xffffffff;
          if (uVar7 < 0xffffffff) {
            uVar3 = uVar7;
          }
          local_e8.context.file._0_4_ = (int)uVar3;
          uVar7 = uVar7 - uVar3;
        }
        local_78 = uVar7;
        local_70 = &local_e8;
        iVar2 = (*processChunk.
                  super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
                  m_bound_entity.fun)
                          (init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.
                           m_thunk_ptr,&local_70,&local_78);
      } while (iVar2 == 0);
      if (iVar2 == -4) {
        local_70._0_4_ = 2;
        local_70._4_4_ = 0;
        uStack_68 = 0;
        uStack_64 = 0;
        local_5c = 0;
        local_58 = "default";
        pcVar5 = "qCompress";
        if (op != Compression) {
          pcVar5 = "qUncompress";
        }
        QMessageLogger::warning((QMessageLogger *)&local_70,"%s: %s",pcVar5,"Not enough memory");
LAB_003001bc:
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      else if (iVar2 == -3) {
        local_70._0_4_ = 2;
        local_70._4_4_ = 0;
        uStack_68 = 0;
        uStack_64 = 0;
        local_5c = 0;
        local_58 = "default";
        QMessageLogger::warning
                  ((QMessageLogger *)&local_70,"%s: %s","qUncompress","Input data is corrupted");
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      else if (iVar2 == 1) {
        lVar4 = out->size - (uStack_c8 & 0xffffffff);
        out->size = lVar4;
        out->ptr[lVar4] = '\0';
        pDVar1 = out->d;
        pcVar5 = out->ptr;
        out->d = (Data *)0x0;
        out->ptr = (char *)0x0;
        (__return_storage_ptr__->d).d = pDVar1;
        (__return_storage_ptr__->d).ptr = pcVar5;
        qVar6 = out->size;
        out->size = 0;
        (__return_storage_ptr__->d).size = qVar6;
      }
      else {
        unexpectedZlibError(__return_storage_ptr__,op,iVar2,pcStack_b8);
      }
      local_70 = &local_e8;
      (*deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_bound_entity.fun)
                (processChunk.
                 super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
                 m_thunk_ptr);
    }
    else {
      unexpectedZlibError(__return_storage_ptr__,op,iVar2,pcStack_b8);
    }
  }
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray xxflate(ZLibOp op, QArrayDataPointer<char> out, QByteArrayView input,
                          qxp::function_ref<int(z_stream *) const> init,
                          qxp::function_ref<int(z_stream *, size_t) const> processChunk,
                          qxp::function_ref<void(z_stream *) const> deinit)
{
    if (out.data() == nullptr) // allocation failed
        return tooMuchData(op);
    qsizetype capacity = out.allocatedCapacity();

    const auto initalSize = out.size;

    z_stream zs = {};
    zs.next_in = reinterpret_cast<uchar *>(const_cast<char *>(input.data())); // 1980s C API...
    if (const int err = init(&zs); err != Z_OK)
        return unexpectedZlibError(op, err, zs.msg);
    const auto sg = qScopeGuard([&] { deinit(&zs); });

    using ZlibChunkSize_t = decltype(zs.avail_in);
    static_assert(!std::is_signed_v<ZlibChunkSize_t>);
    static_assert(std::is_same_v<ZlibChunkSize_t, decltype(zs.avail_out)>);
    constexpr auto MaxChunkSize = std::numeric_limits<ZlibChunkSize_t>::max();
    [[maybe_unused]]
    constexpr auto MaxStatisticsSize = std::numeric_limits<decltype(zs.total_out)>::max();

    size_t inputLeft = size_t(input.size());

    int res;
    do {
        Q_ASSERT(out.freeSpaceAtBegin() == 0); // ensure prepend optimization stays out of the way
        Q_ASSERT(capacity == out.allocatedCapacity());

        if (zs.avail_out == 0) {
            Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                     size_t(out.size) - initalSize == zs.total_out);
            Q_ASSERT(out.size <= capacity);

            qsizetype avail_out = capacity - out.size;
            if (avail_out == 0) {
                out->reallocateAndGrow(QArrayData::GrowsAtEnd, 1); // grow to next natural capacity
                if (out.data() == nullptr) // reallocation failed
                    return tooMuchData(op);
                capacity = out.allocatedCapacity();
                avail_out = capacity - out.size;
            }
            zs.next_out = reinterpret_cast<uchar *>(out.data()) + out.size;
            zs.avail_out = size_t(avail_out) > size_t(MaxChunkSize) ? MaxChunkSize
                                                                    : ZlibChunkSize_t(avail_out);
            out.size += zs.avail_out;

            Q_ASSERT(zs.avail_out > 0);
        }

        if (zs.avail_in == 0) {
            // zs.next_in is kept up-to-date by processChunk(), so nothing to do
            zs.avail_in = inputLeft > MaxChunkSize ? MaxChunkSize : ZlibChunkSize_t(inputLeft);
            inputLeft -= zs.avail_in;
        }

        res = processChunk(&zs, inputLeft);
    } while (res == Z_OK);

    switch (res) {
    case Z_STREAM_END:
        out.size -= zs.avail_out;
        Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                 size_t(out.size) - initalSize == zs.total_out);
        Q_ASSERT(out.size <= out.allocatedCapacity());
        out.data()[out.size] = '\0';
        return QByteArray(std::move(out));

    case Z_MEM_ERROR:
        return tooMuchData(op);

    case Z_BUF_ERROR:
        Q_UNREACHABLE(); // cannot happen - we supply a buffer that can hold the result,
                         // or else error out early

    case Z_DATA_ERROR:   // can only happen on decompression
        Q_ASSERT(op == ZLibOp::Decompression);
        return invalidCompressedData();

    default:
        return unexpectedZlibError(op, res, zs.msg);
    }
}